

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupOrderAiger(Gia_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  long lVar13;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar12];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001d864f;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) {
LAB_001d866e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001d866e;
      pGVar3[iVar6].Value = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCis;
    } while (lVar12 < pVVar10->nSize);
  }
  if (0 < p->nObjs) {
    lVar13 = 8;
    lVar12 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar13 + -8);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        uVar7 = *(uint *)((long)pGVar3 + lVar13 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar7 < 0) ||
           (uVar1 = *(uint *)((long)pGVar3 +
                             lVar13 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001d868d;
        iVar6 = Gia_ManAppendAnd(p_00,uVar7 ^ (uint)(uVar4 >> 0x1d) & 1,
                                 uVar1 ^ (uint)(uVar4 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar13) = iVar6;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar12];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_001d864f:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar6;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001d868d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar7 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                   pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value)
      ;
      pGVar3->Value = uVar7;
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
  Gia_ManDupRemapEquiv(p_00,p);
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar6 = Gia_ManIsNormalized(p_00);
  if (iVar6 != 0) {
    return p_00;
  }
  __assert_fail("Gia_ManIsNormalized(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x208,"Gia_Man_t *Gia_ManDupOrderAiger(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOrderAiger( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( Gia_ManIsNormalized(pNew) );
    return pNew;
}